

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareNextTestCase
          (LengthOfVectorAndMatrixTest *this,GLuint test_case_index)

{
  size_type sVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  GLchar *local_1c0 [3];
  MessageBuilder local_1a8;
  reference local_28;
  testCase *test_case;
  LengthOfVectorAndMatrixTest *pLStack_18;
  GLuint test_case_index_local;
  LengthOfVectorAndMatrixTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this->m_current_test_case_index = 0;
    this_local._7_1_ = true;
  }
  else {
    test_case._4_4_ = test_case_index;
    pLStack_18 = this;
    sVar1 = std::
            vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
            ::size(&this->m_test_cases);
    if (test_case._4_4_ < sVar1) {
      local_28 = std::
                 vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
                 ::operator[](&this->m_test_cases,(ulong)this->m_current_test_case_index);
      this_00 = deqp::Context::getTestContext(*(Context **)&this->field_0x70);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [14])0x29d10a4);
      local_1c0[0] = Utils::getTypeName(local_28->m_type,local_28->m_n_cols,local_28->m_n_rows);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1c0);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LengthOfVectorAndMatrixTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		m_current_test_case_index = 0;
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Tested type: "
										<< Utils::getTypeName(test_case.m_type, test_case.m_n_cols, test_case.m_n_rows)
										<< tcu::TestLog::EndMessage;

	return true;
}